

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogConverterCustomText.h
# Opt level: O0

void __thiscall
nowtech::log::
ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
::append<int>(ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
              *this,int aValue,int aBase,uint8_t aFill)

{
  byte bVar1;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
  *in_RDI;
  int mod;
  bool negative;
  uint8_t where;
  char tmpBuffer [100];
  uint8_t tmpFill;
  int tmpValue;
  bool local_99;
  int local_90;
  byte local_89;
  char local_88 [111];
  byte local_19;
  int local_18;
  int local_10;
  int local_c;
  
  if ((in_EDX < 2) || (0x10 < in_EDX)) {
    append(in_RDI,'#');
  }
  else {
    local_19 = in_CL;
    local_18 = in_ESI;
    local_10 = in_EDX;
    local_c = in_ESI;
    if (in_EDX == 2) {
      append(in_RDI,'0');
      append(in_RDI,'b');
    }
    else if (in_EDX == 0x10) {
      append(in_RDI,'0');
      append(in_RDI,'x');
    }
    else if (in_EDX != 10) {
      append(in_RDI,'0');
      append(in_RDI,'!');
    }
    local_89 = 0;
    bVar1 = local_89;
    do {
      local_89 = bVar1;
      local_90 = local_18 % local_10;
      if (local_90 < 0) {
        local_90 = -local_90;
      }
      local_88[local_89] = "0123456789abcdef"[local_90];
      bVar1 = local_89 + 1;
      local_18 = local_18 / local_10;
      local_99 = local_18 != 0 && bVar1 < 100;
    } while (local_99);
    if (bVar1 < 100) {
      if (local_c < 0) {
        append(in_RDI,'-');
      }
      if (bVar1 < local_19) {
        for (local_19 = local_19 - bVar1; local_19 != 0; local_19 = local_19 - 1) {
          append(in_RDI,'0');
        }
      }
      for (; local_89 != 0; local_89 = local_89 - 1) {
        append(in_RDI,local_88[local_89]);
      }
      append(in_RDI,local_88[0]);
    }
    else {
      append(in_RDI,'#');
    }
  }
  return;
}

Assistant:

void append(tValue const aValue, tValue const aBase, uint8_t const aFill) noexcept {
    tValue tmpValue = aValue;
    uint8_t tmpFill = aFill;
    if((aBase <= NumericSystem::csInvalid) || (aBase > NumericSystem::csBaseMax)) {
      append(csNumericError);
      return;
    }
    else { // nothing to do
    }
    if(tAppendBasePrefix) {
      if (aBase == 2u) {
        append(csNumericFill);
        append(csNumericMarkBinary);
      }
      else if(aBase == 16u) {
        append(csNumericFill);
        append(csNumericMarkHexadecimal);
      }
      else if(aBase != 10u) {
        append(csNumericFill);
        append(csNumericMarkOther);
      }
      else { // nothing to do
      }
    }
    char tmpBuffer[tAppendStackBufferSize];
    uint8_t where = 0u;
    bool negative = aValue < 0;
    do {
      tValue mod = tmpValue % aBase;
      if(mod < 0) {
        mod = -mod;
      }
      else { // nothing to do
      }
      tmpBuffer[where] = csDigit2char[mod];
      ++where;
      tmpValue /= aBase;
    } while((tmpValue != 0) && (where < tAppendStackBufferSize));
    if(where >= tAppendStackBufferSize) {
      append(csNumericError);
      return;
    }
    else { // nothing to do
    }
    if(negative) {
      append(csMinus);
    }
    else if(tAlignSigned && (aFill > 0u)) {
      append(csSpace);
    }
    else { // nothing to do
    }
    if(tmpFill > where) {
      tmpFill -= where;
      while(tmpFill > 0u) {
        append(csNumericFill);
        --tmpFill;
      }
    }
    for(--where; where > 0u; --where) {
      append(tmpBuffer[where]);
    }
    append(tmpBuffer[0]);
  }